

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

RangeListSyntax * __thiscall slang::parsing::Parser::parseRangeList(Parser *this)

{
  SyntaxNode **ppSVar1;
  bool bVar2;
  int iVar3;
  SourceLocation SVar4;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  RangeListSyntax *pRVar6;
  Info *extraout_RDX;
  Info *src;
  size_t extraout_RDX_00;
  TokenKind TVar7;
  ulong uVar8;
  Token current;
  Token TVar9;
  Token openBrace;
  Token local_210;
  Token local_200;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f0;
  undefined1 local_1e0;
  Token local_1d8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_1c8 [7];
  
  Token::Token(&local_1d8);
  Token::Token(&local_210);
  local_1d8 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  if ((local_1d8._0_4_ >> 0x10 & 1) != 0) {
    SVar4 = Token::location(&local_1d8);
    local_210 = ParserBase::missingToken(&this->super_ParserBase,CloseBrace,SVar4);
    local_1c8[0].elements._M_ptr = (pointer)0x0;
    local_1c8[0].super_SyntaxListBase.childCount = 0;
    goto LAB_002fce77;
  }
  ppSVar1 = &local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)ppSVar1;
  current = ParserBase::peek(&this->super_ParserBase);
  local_200 = current;
  bVar2 = slang::syntax::SyntaxFacts::isEndOfBracedList(current.kind);
  if (bVar2) {
    bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar2) {
      SVar4 = Token::location(&local_200);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x580005,SVar4);
    }
    local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
LAB_002fce41:
    src = local_210.info;
  }
  else {
    bVar2 = slang::syntax::SyntaxFacts::isPossibleValueRangeElement(current.kind);
    if (bVar2) {
      while( true ) {
        pEVar5 = parseValueRangeElement
                           (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
        local_1f0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
        local_1e0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar7 = TVar9.kind;
        bVar2 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar7);
        if (TVar7 == EndOfFile || bVar2) break;
        if (TVar7 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar2 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                              (&this->super_ParserBase,(DiagCode)0x580005,false);
            if (!bVar2) {
              local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
              goto LAB_002fce41;
            }
            bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar2);
        }
        local_1f0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1e0 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar7 = TVar9.kind;
        bVar2 = slang::syntax::SyntaxFacts::isEndOfBracedList(TVar7);
        if (TVar7 == EndOfFile || bVar2) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if (current.info == TVar9.info && current.kind == TVar7) {
          bVar2 = ParserBase::
                  skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfBracedList>
                            (&this->super_ParserBase,(DiagCode)0x580005,true);
          if (!bVar2) break;
        }
        uVar8 = TVar9._0_8_ & 0xffffffff;
        current.info = TVar9.info;
        current.kind = (short)uVar8;
        current._2_1_ = (char)(uVar8 >> 0x10);
        current.numFlags.raw = (char)(uVar8 >> 0x18);
        current.rawLen = (int)(uVar8 >> 0x20);
        local_200 = TVar9;
      }
      local_210 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
      goto LAB_002fce41;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,current,CloseBrace,&local_210,(DiagCode)0x580005);
    src = extraout_RDX;
  }
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_1c8[0].elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  if ((SyntaxNode **)local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase != ppSVar1) {
    operator_delete(local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase);
  }
  local_1c8[0].super_SyntaxListBase.childCount = extraout_RDX_00;
LAB_002fce77:
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b12b0;
  local_1c8[0].elements._M_extent._M_extent_value = local_1c8[0].super_SyntaxListBase.childCount;
  pRVar6 = slang::syntax::SyntaxFactory::rangeList(&this->factory,local_1d8,local_1c8,local_210);
  return pRVar6;
}

Assistant:

RangeListSyntax& Parser::parseRangeList() {
    Token openBrace;
    Token closeBrace;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleValueRangeElement, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBrace, list, closeBrace,
        RequireItems::True, diag::ExpectedValueRangeElement,
        [this] { return &parseValueRangeElement(); });

    return factory.rangeList(openBrace, list, closeBrace);
}